

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O0

int __thiscall AggressiveBotStrategy::attackNumDice(AggressiveBotStrategy *this)

{
  int iVar1;
  int local_14;
  int numDice;
  AggressiveBotStrategy *this_local;
  
  iVar1 = Map::Country::getNumberOfTroops((this->super_PlayerStrategy).from);
  if (iVar1 < 4) {
    local_14 = Map::Country::getNumberOfTroops((this->super_PlayerStrategy).from);
    local_14 = local_14 + -1;
  }
  else {
    local_14 = 3;
  }
  return local_14;
}

Assistant:

int AggressiveBotStrategy::attackNumDice() {
    int numDice = 0;
    if (from->getNumberOfTroops() > 3) {
        numDice = 3;
    }
    else {
        numDice = from->getNumberOfTroops() - 1;
    }
    return numDice;
}